

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

RepeatedField<unsigned_long> *
google::protobuf::internal::TcParser::RefAt<google::protobuf::RepeatedField<unsigned_long>>
          (void *x,size_t offset)

{
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<unsigned_long> *target;
  size_t offset_local;
  void *x_local;
  
  pRVar1 = (RepeatedField<unsigned_long> *)((long)x + offset);
  if (((ulong)pRVar1 & 7) != 0) {
    AlignFail(pRVar1);
  }
  return pRVar1;
}

Assistant:

static inline T& RefAt(void* x, size_t offset) {
    T* target = reinterpret_cast<T*>(static_cast<char*>(x) + offset);
#if !defined(NDEBUG) && !(defined(_MSC_VER) && defined(_M_IX86))
    // Check the alignment in debug mode, except in 32-bit msvc because it does
    // not respect the alignment as expressed by `alignof(T)`
    if (ABSL_PREDICT_FALSE(reinterpret_cast<uintptr_t>(target) % alignof(T) !=
                           0)) {
      AlignFail(std::integral_constant<size_t, alignof(T)>(),
                reinterpret_cast<uintptr_t>(target));
    }
#endif
    return *target;
  }